

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferBlockReferencedByShaderSingleBlockContentCases<(glu::Storage)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               int expandLevel)

{
  Node *ptr;
  StorageQualifier *this;
  InterfaceBlock *pIVar1;
  Variable *pVVar2;
  ResourceTestCase *pRVar3;
  ArrayElement *this_00;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_2;
  SharedPtr storage;
  SharedPtr defaultBlock;
  ProgramResourceQueryTestTarget local_28;
  
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,ptr);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,&defaultBlock,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&storage,(Node *)this);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,&storage,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,&block,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&dummyVariable_2,
             PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,&dummyVariable,(ProgramResourceQueryTestTarget *)&dummyVariable_2,
             "named_block");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,&storage,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,&block,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&dummyVariable_2,
             PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,&dummyVariable,(ProgramResourceQueryTestTarget *)&dummyVariable_2,
             "unnamed_block");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  this_00 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this_00,&storage,3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)this_00);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,&block,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,&dummyVariable,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable_2,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_28,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase(pRVar3,context,&dummyVariable_2,&local_28,"block_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable_2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&storage);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  return;
}

Assistant:

static void generateBufferBlockReferencedByShaderSingleBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, int expandLevel)
{
	const ProgramInterface						programInterface	= (Storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																      (Storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																      (PROGRAMINTERFACE_LAST);
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	storage				(new ResourceDefinition::StorageQualifier(defaultBlock, Storage));

	DE_UNREF(expandLevel);

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "named_block"));
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "unnamed_block"));
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(storage, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "block_array"));
	}
}